

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.h
# Opt level: O3

Identifier * __thiscall jsonnet::internal::Allocator::makeIdentifier(Allocator *this,UString *name)

{
  pointer pcVar1;
  iterator iVar2;
  u32string *puVar3;
  mapped_type *ppIVar4;
  
  iVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
                  *)this,name);
  if ((_Rb_tree_header *)iVar2._M_node ==
      &(this->internedIdentifiers)._M_t._M_impl.super__Rb_tree_header) {
    puVar3 = (u32string *)operator_new(0x20);
    *(u32string **)puVar3 = puVar3 + 0x10;
    pcVar1 = (name->_M_dataplus)._M_p;
    std::__cxx11::u32string::_M_construct<char32_t*>(puVar3,pcVar1,pcVar1 + name->_M_string_length);
    ppIVar4 = std::
              map<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*,_std::less<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_const_jsonnet::internal::Identifier_*>_>_>
              ::operator[](&this->internedIdentifiers,name);
    *ppIVar4 = (mapped_type)puVar3;
  }
  else {
    puVar3 = *(u32string **)(iVar2._M_node + 2);
  }
  return (Identifier *)puVar3;
}

Assistant:

const Identifier *makeIdentifier(const UString &name)
    {
        auto it = internedIdentifiers.find(name);
        if (it != internedIdentifiers.end()) {
            return it->second;
        }
        auto r = new Identifier(name);
        internedIdentifiers[name] = r;
        return r;
    }